

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnHello(void)

{
  ostream *poVar1;
  runtime_error *_except_;
  Modifier reset;
  Modifier bold;
  Modifier def;
  Modifier green;
  string logo;
  Modifier *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  Modifier local_4c;
  Modifier local_48;
  Modifier local_44;
  Modifier local_40 [5];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "----------------------------------------------------------------------------------------------\n           _\n          | |\n     __  _| |     ___  __ _ _ __ _ __\n     \\ \\/ / |    / _ \\/ _` | \'__| \'_ \\ \n      >  <| |___|  __/ (_| | |  | | | |\n     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n        xLearn   -- 0.44 Version --\n----------------------------------------------------------------------------------------------\n\n"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  Color::Modifier::Modifier(local_40,FG_GREEN);
  Color::Modifier::Modifier(&local_44,FG_DEFAULT);
  Color::Modifier::Modifier(&local_48,BOLD);
  Color::Modifier::Modifier(&local_4c,RESET);
  Color::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  poVar1 = Color::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::operator<<(poVar1,local_28);
  poVar1 = Color::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Color::operator<<(poVar1,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

XL_DLL int XLearnHello() {
  API_BEGIN();
  std::string logo = 
"----------------------------------------------------------------------------------------------\n"
                    "           _\n"
                    "          | |\n"
                    "     __  _| |     ___  __ _ _ __ _ __\n"
                    "     \\ \\/ / |    / _ \\/ _` | '__| '_ \\ \n"
                    "      >  <| |___|  __/ (_| | |  | | | |\n"
                    "     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n"
                    "        xLearn   -- 0.44 Version --\n"
"----------------------------------------------------------------------------------------------\n"
"\n";
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier def(Color::FG_DEFAULT);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << green << bold << logo << def << reset;
  API_END();
}